

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
libcellml::Units::unitAttributes
          (Units *this,StandardUnit standardUnit,string *prefix,double *exponent,double *multiplier,
          string *id)

{
  UnitsImpl *this_00;
  mapped_type *reference;
  const_iterator cVar1;
  StandardUnit standardUnit_local;
  string dummyReference;
  
  dummyReference._M_dataplus._M_p = (pointer)&dummyReference.field_2;
  dummyReference._M_string_length = 0;
  dummyReference.field_2._M_local_buf[0] = '\0';
  this_00 = (UnitsImpl *)(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  standardUnit_local = standardUnit;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,&standardUnit_local);
  cVar1 = UnitsImpl::findUnit(this_00,reference);
  unitAttributes(this,(long)((long)cVar1._M_current -
                            (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].
                            mId.field_2._M_allocated_capacity) / 0x70,&dummyReference,prefix,
                 exponent,multiplier,id);
  std::__cxx11::string::~string((string *)&dummyReference);
  return;
}

Assistant:

void Units::unitAttributes(StandardUnit standardUnit, std::string &prefix, double &exponent, double &multiplier, std::string &id) const
{
    std::string dummyReference;
    unitAttributes(static_cast<size_t>(pFunc()->findUnit(standardUnitToString.at(standardUnit)) - pFunc()->mUnitDefinitions.begin()), dummyReference, prefix, exponent, multiplier, id);
}